

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.h
# Opt level: O0

void __thiscall cmCTest::PartInfo::~PartInfo(PartInfo *this)

{
  PartInfo *this_local;
  
  std::__cxx11::string::~string((string *)&this->Name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->SubmitFiles);
  return;
}

Assistant:

const std::string& GetName() const { return this->Name; }